

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void printClauseArray(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *__ptr;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  iVar2 = clauses;
  lVar4 = (long)clauses;
  if (booleanOptions[2] == 0) {
    __ptr = (int *)malloc(lVar4 * 4);
    auVar1 = _DAT_00104020;
    if (0 < iVar2) {
      lVar4 = lVar4 + -1;
      auVar5._8_4_ = (int)lVar4;
      auVar5._0_8_ = lVar4;
      auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar3 = 0;
      auVar5 = auVar5 ^ _DAT_00104020;
      auVar6 = _DAT_00104010;
      do {
        auVar7 = auVar6 ^ auVar1;
        if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                    auVar5._4_4_ < auVar7._4_4_) & 1)) {
          __ptr[uVar3] = (int)uVar3;
        }
        if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
            auVar7._12_4_ <= auVar5._12_4_) {
          __ptr[uVar3 + 1] = (int)uVar3 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar4 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar4 + 2;
      } while ((iVar2 + 1U & 0xfffffffe) != uVar3);
    }
  }
  else {
    __ptr = getRandomFromZero(clauses);
  }
  if (0 < clauses) {
    lVar4 = 0;
    do {
      printClause(clauseArray + __ptr[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < clauses);
  }
  free(__ptr);
  return;
}

Assistant:

void printClauseArray()
{
    int i;

    int *clauseOrder;

    if (booleanOptions[REORDER])
        clauseOrder = getRandomFromZero (clauses);
    else
        clauseOrder = getIdentityFromZero (clauses);

    for (i=0;i<clauses;i++)
        printClause (&clauseArray[clauseOrder[i]]);

    free (clauseOrder);
}